

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasHeat2D_kry.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  N_Vector uu;
  N_Vector up;
  N_Vector res;
  void *pvVar3;
  UserData data;
  N_Vector returnvalue;
  bool bVar4;
  int retval;
  void *local_78;
  double local_70;
  void *local_68;
  SUNContext ctx;
  long ncfn;
  long netf;
  sunrealtype tret;
  void *local_40;
  long ncfl;
  
  retval = SUNContext_Create(0,&ctx);
  iVar2 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    uu = (N_Vector)N_VNew_Serial(100,ctx);
    iVar1 = check_retval(uu,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      up = (N_Vector)N_VClone(uu);
      iVar1 = check_retval(up,"N_VNew_Serial",0);
      if (iVar1 == 0) {
        res = (N_Vector)N_VClone(uu);
        iVar1 = check_retval(res,"N_VNew_Serial",0);
        if (iVar1 == 0) {
          pvVar3 = (void *)N_VClone(uu);
          iVar1 = check_retval(pvVar3,"N_VNew_Serial",0);
          if (iVar1 == 0) {
            data = (UserData)malloc(0x20);
            data->pp = (N_Vector)0x0;
            iVar1 = check_retval(data,"malloc",2);
            if (iVar1 == 0) {
              data->mm = 10;
              data->dx = 0.1111111111111111;
              data->coeff = 81.0;
              returnvalue = (N_Vector)N_VClone(uu);
              data->pp = returnvalue;
              iVar1 = check_retval(returnvalue,"N_VNew_Serial",0);
              if (iVar1 == 0) {
                SetInitialProfile(data,uu,up,res);
                N_VConst(0x3ff0000000000000,pvVar3);
                local_78 = (void *)IDACreate(ctx);
                local_40 = local_78;
                iVar1 = check_retval(local_78,"IDACreate",0);
                if (iVar1 == 0) {
                  retval = IDASetUserData(local_78,data);
                  iVar2 = 1;
                  iVar1 = check_retval(&retval,"IDASetUserData",1);
                  if (iVar1 == 0) {
                    retval = IDASetConstraints(local_78,pvVar3);
                    iVar2 = 1;
                    iVar1 = check_retval(&retval,"IDASetConstraints",1);
                    if (iVar1 == 0) {
                      N_VDestroy(pvVar3);
                      retval = IDAInit(0,local_78,resHeat,uu,up);
                      iVar2 = 1;
                      iVar1 = check_retval(&retval,"IDAInit",1);
                      if (iVar1 == 0) {
                        retval = IDASStolerances(0,0x3f50624dd2f1a9fc,local_78);
                        iVar2 = 1;
                        iVar1 = check_retval(&retval,"IDASStolerances",1);
                        if (iVar1 == 0) {
                          iVar2 = 1;
                          local_68 = (void *)SUNLinSol_SPGMR(uu,1,0,ctx);
                          iVar1 = check_retval(local_68,"SUNLinSol_SPGMR",0);
                          if (iVar1 == 0) {
                            retval = SUNLinSol_SPGMRSetMaxRestarts(local_68,5);
                            iVar2 = 1;
                            iVar1 = check_retval(&retval,"SUNLinSol_SPGMRSetMaxRestarts",1);
                            if (iVar1 == 0) {
                              retval = IDASetLinearSolver(local_78,local_68,0);
                              iVar2 = 1;
                              iVar1 = check_retval(&retval,"IDASetLinearSolver",1);
                              if (iVar1 == 0) {
                                retval = IDASetPreconditioner(local_78,PsetupHeat,PsolveHeat);
                                iVar2 = 1;
                                iVar1 = check_retval(&retval,"IDASetPreconditioner",1);
                                if (iVar1 == 0) {
                                  puts(
                                      "\nidasHeat2D_kry: Heat equation, serial example problem for IDA "
                                      );
                                  puts(
                                      "                Discretized heat equation on 2D unit square. "
                                      );
                                  printf("                Zero boundary conditions,");
                                  puts(" polynomial initial conditions.");
                                  printf("                Mesh dimensions: %d x %d",10);
                                  printf("     Total system size: %d\n\n",100);
                                  printf("Tolerance parameters:  rtol = %g   atol = %g\n",0,
                                         0x3f50624dd2f1a9fc);
                                  puts("Constraints set to force all solution components >= 0. ");
                                  puts(
                                      "Linear solver: SPGMR, preconditioner using diagonal elements. "
                                      );
                                  puts("\n\nCase 1: gsytpe = SUN_MODIFIED_GS");
                                  puts("\n   Output Summary (umax = max-norm of solution) \n");
                                  puts(
                                      "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps"
                                      );
                                  puts(
                                      "----------------------------------------------------------------------"
                                      );
                                  local_70 = 0.01;
                                  iVar1 = 0xb;
                                  while (pvVar3 = local_78, bVar4 = iVar1 != 0, iVar1 = iVar1 + -1,
                                        bVar4) {
                                    retval = IDASolve(local_70,local_78,&tret,uu,up,1);
                                    iVar2 = check_retval(&retval,"IDASolve",1);
                                    if (iVar2 != 0) {
                                      return 1;
                                    }
                                    PrintOutput(local_78,tret,uu);
                                    local_70 = local_70 + local_70;
                                  }
                                  retval = IDAGetNumErrTestFails(local_78,&netf);
                                  iVar2 = 1;
                                  check_retval(&retval,"IDAGetNumErrTestFails",1);
                                  retval = IDAGetNumNonlinSolvConvFails(pvVar3,&ncfn);
                                  check_retval(&retval,"IDAGetNumNonlinSolvConvFails",1);
                                  retval = IDAGetNumLinConvFails(pvVar3,&ncfl);
                                  check_retval(&retval,"IDAGetNumLinConvFails",1);
                                  printf("\nError test failures            = %ld\n",netf);
                                  printf("Nonlinear convergence failures = %ld\n",ncfn);
                                  printf("Linear convergence failures    = %ld\n",ncfl);
                                  SetInitialProfile(data,uu,up,res);
                                  retval = IDAReInit(0,pvVar3,uu,up);
                                  iVar1 = check_retval(&retval,"IDAReInit",1);
                                  if (iVar1 == 0) {
                                    retval = SUNLinSol_SPGMRSetGSType(local_68,2);
                                    iVar2 = 1;
                                    iVar1 = check_retval(&retval,"SUNLinSol_SPGMRSetGSType",1);
                                    if (iVar1 == 0) {
                                      puts("\n\nCase 2: gstype = SUN_CLASSICAL_GS");
                                      puts("\n   Output Summary (umax = max-norm of solution) \n");
                                      puts(
                                          "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps"
                                          );
                                      puts(
                                          "----------------------------------------------------------------------"
                                          );
                                      local_70 = 0.01;
                                      iVar1 = 0xb;
                                      while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
                                        retval = IDASolve(local_70,local_78,&tret,uu,up,1);
                                        iVar2 = check_retval(&retval,"IDASolve",1);
                                        if (iVar2 != 0) {
                                          return 1;
                                        }
                                        local_78 = local_40;
                                        PrintOutput(local_40,tret,uu);
                                        local_70 = local_70 + local_70;
                                      }
                                      retval = IDAGetNumErrTestFails(local_78,&netf);
                                      check_retval(&retval,"IDAGetNumErrTestFails",1);
                                      pvVar3 = local_40;
                                      retval = IDAGetNumNonlinSolvConvFails(local_40,&ncfn);
                                      check_retval(&retval,"IDAGetNumNonlinSolvConvFails",1);
                                      retval = IDAGetNumLinConvFails(pvVar3);
                                      check_retval(&retval,"IDAGetNumLinConvFails",1);
                                      iVar2 = 0;
                                      printf("\nError test failures            = %ld\n",netf);
                                      printf("Nonlinear convergence failures = %ld\n",ncfn);
                                      printf("Linear convergence failures    = %ld\n",ncfl);
                                      IDAFree(&local_40);
                                      SUNLinSolFree(local_68);
                                      N_VDestroy(uu);
                                      N_VDestroy(up);
                                      N_VDestroy(res);
                                      N_VDestroy(data->pp);
                                      free(data);
                                      SUNContext_Free(&ctx);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, res;
  int retval, iout;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  long int netf, ncfn, ncfl;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = res = NULL;
  LS                          = NULL;

  /* Create the SUNDIALS context object for this simulation */

  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate N-vectors and the user data structure. */

  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }

  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }

  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  data     = (UserData)malloc(sizeof *data);
  data->pp = NULL;
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  /* Assign parameters in the user data structure. */

  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / (data->dx * data->dx);
  data->pp    = N_VClone(uu);
  if (check_retval((void*)data->pp, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Set constraints to all 1's for nonnegative solution values. */

  N_VConst(ONE, constraints);

  /* Assign various parameters. */

  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, resHeat, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create the linear solver SUNLinSol_SPGMR with left preconditioning
     and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(uu, SUN_PREC_LEFT, 0, ctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* IDA recommends allowing up to 5 restarts (default is 0) */
  retval = SUNLinSol_SPGMRSetMaxRestarts(LS, 5);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

  /* Attach the linear sovler */
  retval = IDASetLinearSolver(mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = IDASetPreconditioner(mem, PsetupHeat, PsolveHeat);
  if (check_retval(&retval, "IDASetPreconditioner", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  /*
   * -------------------------------------------------------------------------
   * CASE I
   * -------------------------------------------------------------------------
   */

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 1: gsytpe = SUN_MODIFIED_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /*
   * -------------------------------------------------------------------------
   * CASE II
   * -------------------------------------------------------------------------
   */

  /* Re-initialize uu, up. */

  SetInitialProfile(data, uu, up, res);

  /* Re-initialize IDA and SPGMR */

  retval = IDAReInit(mem, t0, uu, up);
  if (check_retval(&retval, "IDAReInit", 1)) { return (1); }

  retval = SUNLinSol_SPGMRSetGSType(LS, SUN_CLASSICAL_GS);
  if (check_retval(&retval, "SUNLinSol_SPGMRSetGSType", 1)) { return (1); }

  /* Print case number, output table heading, and initial line of table. */

  printf("\n\nCase 2: gstype = SUN_CLASSICAL_GS\n");
  printf("\n   Output Summary (umax = max-norm of solution) \n\n");
  printf(
    "  time     umax       k  nst  nni  nje   nre   nreLS    h      npe nps\n");
  printf(
    "----------------------------------------------------------------------\n");

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters. */

  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);

  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);

  retval = IDAGetNumLinConvFails(mem, &ncfl);
  check_retval(&retval, "IDAGetNumLinConvFails", 1);

  printf("\nError test failures            = %ld\n", netf);
  printf("Nonlinear convergence failures = %ld\n", ncfn);
  printf("Linear convergence failures    = %ld\n", ncfl);

  /* Free Memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);

  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(res);

  N_VDestroy(data->pp);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}